

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_get_handle_max(BEGIN_HANDLE begin,handle *handle_max_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  BEGIN_INSTANCE *begin_instance;
  uint32_t item_count;
  int result;
  handle *handle_max_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xb9f;
  }
  else {
    _item_count = handle_max_value;
    handle_max_value_local = (handle *)begin;
    iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,(uint32_t *)&begin_instance);
    if (iVar1 == 0) {
      if ((uint)begin_instance < 5) {
        *_item_count = 0xffffffff;
        begin_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(begin->composite_value,4);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = 0xffffffff;
          begin_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            begin_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = 0xffffffff;
              begin_instance._4_4_ = 0;
            }
            else {
              begin_instance._4_4_ = 0xbc0;
            }
          }
        }
      }
    }
    else {
      begin_instance._4_4_ = 0xba7;
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_get_handle_max(BEGIN_HANDLE begin, handle* handle_max_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                *handle_max_value = 4294967295u;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *handle_max_value = 4294967295u;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_handle(item_value, handle_max_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *handle_max_value = 4294967295u;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}